

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

bool google::protobuf::internal::SplitFieldHasExtraIndirection(FieldDescriptor *field)

{
  Nullable<const_char_*> failure_msg;
  bool bStack_19;
  LogMessageFatal LStack_18;
  
  LStack_18.super_LogMessage.errno_saver_.saved_errno_._0_1_ = (byte)field->field_0x1 >> 5 & 1;
  bStack_19 = 0xbf < (byte)field->field_0x1;
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                          ((bool *)&LStack_18,&bStack_19,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return (bool)((field->field_0x1 & 0x20) >> 5);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb54,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

bool SplitFieldHasExtraIndirection(const FieldDescriptor* field) {
  return field->is_repeated();
}